

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O0

void __thiscall skiplist_tests::skiplist_test::test_method(skiplist_test *this)

{
  bool bVar1;
  reference pvVar2;
  long in_FS_OFFSET;
  int to;
  int from;
  int i_2;
  int i_1;
  int i;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vIndex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  CBlockIndex *in_stack_fffffffffffffc08;
  int range;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  lazy_ostream *in_stack_fffffffffffffc20;
  CBlockIndex *in_stack_fffffffffffffc28;
  reference local_340;
  int local_318;
  int local_314;
  int local_310;
  lazy_ostream local_2d8 [2];
  assertion_result local_2b8 [2];
  lazy_ostream local_260 [2];
  assertion_result local_240 [2];
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [2];
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  assertion_result local_150 [2];
  const_string local_118 [2];
  lazy_ostream local_f8 [2];
  assertion_result local_d8 [2];
  const_string local_a0 [2];
  lazy_ostream local_80 [2];
  assertion_result local_60 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<CBlockIndex>::allocator((allocator<CBlockIndex> *)in_stack_fffffffffffffbe8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
             CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
             (size_type)in_stack_fffffffffffffc10,(allocator_type *)in_stack_fffffffffffffc08);
  std::allocator<CBlockIndex>::~allocator((allocator<CBlockIndex> *)in_stack_fffffffffffffbe8);
  for (local_310 = 0; local_310 < 300000; local_310 = local_310 + 1) {
    pvVar2 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    pvVar2->nHeight = local_310;
    if (local_310 == 0) {
      local_340 = (reference)0x0;
    }
    else {
      local_340 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    }
    pvVar2 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    pvVar2->pprev = local_340;
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    CBlockIndex::BuildSkip
              ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  }
  for (local_314 = 0; local_314 < 300000; local_314 = local_314 + 1) {
    if (local_314 < 1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffc28,
                   (const_string *)in_stack_fffffffffffffc20,
                   CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                   (const_string *)in_stack_fffffffffffffc10);
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                   ,SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        in_stack_fffffffffffffbe8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_150,local_170,local_190,0x20,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffbe8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffc28,
                   (const_string *)in_stack_fffffffffffffc20,
                   CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                   (const_string *)in_stack_fffffffffffffc10);
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                   ,SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        in_stack_fffffffffffffbe8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_60,local_80,local_a0,0x1d,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffbe8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffc28,
                   (const_string *)in_stack_fffffffffffffc20,
                   CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                   (const_string *)in_stack_fffffffffffffc10);
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                   ,SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (unsigned_long)in_stack_fffffffffffffbe8);
        in_stack_fffffffffffffbe8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_d8,local_f8,local_118,0x1e,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffbe8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  for (local_318 = 0; range = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20), local_318 < 1000;
      local_318 = local_318 + 1) {
    RandomMixin<FastRandomContext>::randrange<int>(in_stack_fffffffffffffc10,range);
    RandomMixin<FastRandomContext>::randrange<int>(in_stack_fffffffffffffc10,range);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc28,
                 (const_string *)in_stack_fffffffffffffc20,
                 CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (const_string *)in_stack_fffffffffffffc10);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      CBlockIndex::GetAncestor
                ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 in_stack_fffffffffffffbf4);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbe8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1c8,local_1e8,local_208,0x28,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbe8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc28,
                 (const_string *)in_stack_fffffffffffffc20,
                 CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (const_string *)in_stack_fffffffffffffc10);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      in_stack_fffffffffffffc28 =
           CBlockIndex::GetAncestor
                     ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                      in_stack_fffffffffffffbf4);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
      in_stack_fffffffffffffc20 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbe8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_240,local_260,(const_string *)&stack0xfffffffffffffd80,0x29,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc1f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffc1f);
    do {
      in_stack_fffffffffffffc10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc28,
                 (const_string *)in_stack_fffffffffffffc20,
                 CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (const_string *)in_stack_fffffffffffffc10);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      in_stack_fffffffffffffc08 =
           CBlockIndex::GetAncestor
                     ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                      in_stack_fffffffffffffbf4);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::data
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffbe8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 SUB41((uint)in_stack_fffffffffffffbf4 >> 0x18,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (unsigned_long)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbe8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2b8,local_2d8,(const_string *)&stack0xfffffffffffffd08,0x2a,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffbe8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbff = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffbff);
  }
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::~vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(skiplist_test)
{
    std::vector<CBlockIndex> vIndex(SKIPLIST_LENGTH);

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        vIndex[i].nHeight = i;
        vIndex[i].pprev = (i == 0) ? nullptr : &vIndex[i - 1];
        vIndex[i].BuildSkip();
    }

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        if (i > 0) {
            BOOST_CHECK(vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]);
            BOOST_CHECK(vIndex[i].pskip->nHeight < i);
        } else {
            BOOST_CHECK(vIndex[i].pskip == nullptr);
        }
    }

    for (int i=0; i < 1000; i++) {
        int from = m_rng.randrange(SKIPLIST_LENGTH - 1);
        int to = m_rng.randrange(from + 1);

        BOOST_CHECK(vIndex[SKIPLIST_LENGTH - 1].GetAncestor(from) == &vIndex[from]);
        BOOST_CHECK(vIndex[from].GetAncestor(to) == &vIndex[to]);
        BOOST_CHECK(vIndex[from].GetAncestor(0) == vIndex.data());
    }
}